

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.h
# Opt level: O0

void jhu::thrax::removeIndices(Indices *from,Span s)

{
  bool bVar1;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> this;
  bool bVar2;
  iterator __first;
  reference psVar3;
  const_iterator local_68;
  const_iterator local_60;
  short *local_58;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_50;
  short *local_48;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_40;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_38;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> e;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_20;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> b;
  Indices *from_local;
  Span s_local;
  
  b._M_current = (short *)from;
  from_local._4_4_ = s;
  __first = std::vector<short,_std::allocator<short>_>::begin(from);
  e._M_current = (short *)std::vector<short,_std::allocator<short>_>::end(b._M_current);
  local_20 = std::
             lower_bound<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,short>
                       (__first._M_current,e,(short *)((long)&from_local + 4));
  local_40._M_current = (short *)std::vector<short,_std::allocator<short>_>::begin(b._M_current);
  local_48 = (short *)std::vector<short,_std::allocator<short>_>::end(b._M_current);
  local_38 = std::
             lower_bound<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,short>
                       (local_40,(__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>
                                  )local_48,(short *)((long)&from_local + 6));
  local_50._M_current = (short *)std::vector<short,_std::allocator<short>_>::end(b._M_current);
  bVar2 = __gnu_cxx::operator!=(&local_20,&local_50);
  bVar1 = false;
  if (bVar2) {
    psVar3 = __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
             operator*(&local_20);
    bVar1 = *psVar3 < from_local._4_2_;
  }
  if (bVar1) {
    local_58 = (short *)__gnu_cxx::
                        __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
                        operator++(&local_20,0);
  }
  this._M_current = b._M_current;
  __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
  __normal_iterator<short*>
            ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_60,
             &local_20);
  __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
  __normal_iterator<short*>
            ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_68,
             &local_38);
  std::vector<short,_std::allocator<short>_>::erase
            ((vector<short,_std::allocator<short>_> *)this._M_current,local_60,local_68);
  return;
}

Assistant:

inline void removeIndices(Indices& from, Span s) {
  auto b = std::lower_bound(from.begin(), from.end(), s.start);
  auto e = std::lower_bound(from.begin(), from.end(), s.end);
  if (b != from.end() && *b < s.start) {
    b++;
  }
  from.erase(b, e);
}